

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorTest.cpp
# Opt level: O0

void __thiscall IteratorTest_ConstIterator_Test::TestBody(IteratorTest_ConstIterator_Test *this)

{
  bool bVar1;
  AssertionResult gtest_ar;
  pair<Deque<int,_std::allocator<int>_>::DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>,_std::_Deque_iterator<int,_const_int_&,_const_int_*>_>
  p;
  int i;
  deque<int,_std::allocator<int>_> stdDeque;
  Deque<int,_std::allocator<int>_> myDeque;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffe18;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffe20;
  undefined7 in_stack_fffffffffffffe28;
  undefined1 in_stack_fffffffffffffe2f;
  char *rhs_expression;
  char *lhs_expression;
  int line;
  char *file;
  Type in_stack_fffffffffffffe4c;
  AssertHelper *in_stack_fffffffffffffe50;
  value_type *in_stack_fffffffffffffe58;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffe60;
  allocator<int> *in_stack_fffffffffffffe68;
  Deque<int,_std::allocator<int>_> *in_stack_fffffffffffffe70;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe78;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  *in_stack_fffffffffffffe80;
  DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
  *in_stack_fffffffffffffe88;
  Message *in_stack_fffffffffffffe98;
  AssertHelper *in_stack_fffffffffffffea0;
  char local_140 [52];
  int local_10c;
  char local_a1 [161];
  
  file = local_a1;
  std::allocator<int>::allocator((allocator<int> *)0x170271);
  Deque<int,_std::allocator<int>_>::Deque(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
  std::allocator<int>::~allocator((allocator<int> *)0x170292);
  std::deque<int,_std::allocator<int>_>::deque((deque<int,_std::allocator<int>_> *)0x17029f);
  for (local_10c = 0; local_10c < 100; local_10c = local_10c + 1) {
    Deque<int,_std::allocator<int>_>::push_back(in_stack_fffffffffffffe60,in_stack_fffffffffffffe58)
    ;
    std::deque<int,_std::allocator<int>_>::push_back
              ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffe20,
               (value_type *)in_stack_fffffffffffffe18);
  }
  Deque<int,_std::allocator<int>_>::cbegin(in_stack_fffffffffffffe18);
  Deque<int,_std::allocator<int>_>::cend
            ((Deque<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  lhs_expression = &stack0xfffffffffffffe80;
  std::deque<int,_std::allocator<int>_>::cbegin
            ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffe18);
  std::
  mismatch<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,std::_Deque_iterator<int,int_const&,int_const*>>
            (in_stack_fffffffffffffe88,in_stack_fffffffffffffe80,
             (_Deque_iterator<int,_const_int_&,_const_int_*> *)in_stack_fffffffffffffe78.ptr_);
  rhs_expression = local_140;
  Deque<int,_std::allocator<int>_>::cend
            ((Deque<int,_std::allocator<int>_> *)
             CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28));
  testing::internal::EqHelper<false>::
  Compare<Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>,Deque<int,std::allocator<int>>::DequeIterator<int_const,int_const&,int_const*,Deque<int,std::allocator<int>>const>>
            (lhs_expression,rhs_expression,
             (DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
              *)CONCAT17(in_stack_fffffffffffffe2f,in_stack_fffffffffffffe28),
             (DequeIterator<const_int,_const_int_&,_const_int_*,_const_Deque<int,_std::allocator<int>_>_>
              *)in_stack_fffffffffffffe20);
  line = (int)((ulong)lhs_expression >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffe70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe50);
    in_stack_fffffffffffffe20 =
         (Deque<int,_std::allocator<int>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x170451);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,file,line,rhs_expression);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffe20);
    testing::Message::~Message((Message *)0x17049f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1704fb);
  std::deque<int,_std::allocator<int>_>::~deque
            ((deque<int,_std::allocator<int>_> *)in_stack_fffffffffffffe70);
  Deque<int,_std::allocator<int>_>::~Deque(in_stack_fffffffffffffe20);
  return;
}

Assistant:

TEST(IteratorTest, ConstIterator) {
    Deque<int> myDeque;
    std::deque<int> stdDeque;
    for (int i = 0; i < 100; ++i) {
        myDeque.push_back(i);
        stdDeque.push_back(i);
    }
    auto p = std::mismatch(myDeque.cbegin(), myDeque.cend(), stdDeque.cbegin());
    ASSERT_EQ(p.first, myDeque.cend());
}